

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O1

void __thiscall cmSourceFileLocation::Update(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  if ((this->AmbiguousDirectory == true) && (loc->AmbiguousDirectory == false)) {
    std::__cxx11::string::_M_assign((string *)&this->Directory);
    this->AmbiguousDirectory = false;
  }
  if ((this->AmbiguousExtension == true) && (loc->AmbiguousExtension == false)) {
    std::__cxx11::string::_M_assign((string *)&this->Name);
    this->AmbiguousExtension = false;
  }
  return;
}

Assistant:

void cmSourceFileLocation::Update(cmSourceFileLocation const& loc)
{
  if(this->AmbiguousDirectory && !loc.AmbiguousDirectory)
    {
    this->Directory = loc.Directory;
    this->AmbiguousDirectory = false;
    }
  if(this->AmbiguousExtension && !loc.AmbiguousExtension)
    {
    this->Name = loc.Name;
    this->AmbiguousExtension = false;
    }
}